

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

bool anon_unknown.dwarf_45a12::isInsidePathSegment
               (PolylineSegmentedPathwaySegmentRadii *pathway,size_type segmentIndex,Vec3 *point)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float distancePointToPointOnSegmentCenterLine;
  float segmentRadiusAtPoint;
  Vec3 pointOnSegmentCenterLine;
  float segmentDistance;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  uVar1 = (**(code **)(*in_RDI + 0x70))(in_RDI,in_RSI,in_RDX);
  (**(code **)(*in_RDI + 0x78))(uVar1,in_RDI,in_RSI);
  fVar2 = (float)(**(code **)(*in_RDI + 0x80))(uVar1,in_RDI,in_RSI);
  OpenSteer::Vec3::operator-
            ((Vec3 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (Vec3 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  fVar3 = OpenSteer::Vec3::length((Vec3 *)0x143f41);
  return fVar3 < fVar2;
}

Assistant:

bool isInsidePathSegment( OpenSteer::PolylineSegmentedPathwaySegmentRadii const& pathway,  
                              OpenSteer::PolylineSegmentedPathwaySegmentRadii::size_type segmentIndex, 
                              OpenSteer::Vec3 const& point ) {
        assert( pathway.isValid() && "pathway isn't valid." );
        assert( segmentIndex < pathway.segmentCount() && "segmentIndex out of range." );
        
        float const segmentDistance = pathway.mapPointToSegmentDistance( segmentIndex, point );
        OpenSteer::Vec3 const pointOnSegmentCenterLine = pathway.mapSegmentDistanceToPoint( segmentIndex, segmentDistance );
        float const segmentRadiusAtPoint = pathway.mapSegmentDistanceToRadius( segmentIndex, segmentDistance );
        
        float const distancePointToPointOnSegmentCenterLine = (point - pointOnSegmentCenterLine).length();
        
        return distancePointToPointOnSegmentCenterLine < segmentRadiusAtPoint;
    }